

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

uint pcmpxstrx(CPUX86State *env,ZMMReg *d,ZMMReg *s,int8_t ctrl,int valids,int validd)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  sbyte sVar4;
  int iVar5;
  uint8_t *puVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  uint16_t *puVar16;
  
  iVar5 = (uint)((ctrl & 1U) == 0) * 8 + 7;
  uVar12 = valids - 1;
  uVar8 = validd - 1;
  uVar7 = (ulong)((uint)(validd <= iVar5) << 7 | (uint)(valids <= iVar5) << 6);
  env->cc_src = uVar7;
  sVar4 = (sbyte)iVar5;
  switch((byte)ctrl >> 2 & 3) {
  case 0:
    if (0 < valids) {
      uVar3 = 0;
      uVar15 = (ulong)uVar12;
      do {
        switch(ctrl & 3U) {
        case 0:
          uVar12 = (uint)s->_b_ZMMReg[uVar15];
          break;
        case 1:
          uVar12 = (uint)s->_w_ZMMReg[uVar15];
          break;
        case 2:
          uVar12 = (uint)(char)s->_b_ZMMReg[uVar15];
          break;
        case 3:
          uVar12 = (uint)(short)s->_w_ZMMReg[uVar15];
        }
        uVar3 = uVar3 * 2;
        lVar14 = (ulong)uVar8 + 1;
        if (0 < validd) {
          do {
            switch(ctrl & 3U) {
            case 0:
              uVar10 = (uint)d->_b_ZMMReg[lVar14 + -1];
              break;
            case 1:
              uVar10 = (uint)*(ushort *)((long)d + lVar14 * 2 + -2);
              break;
            case 2:
              uVar10 = (uint)(char)d->_b_ZMMReg[lVar14 + -1];
              break;
            case 3:
              uVar10 = (uint)*(short *)((long)d + lVar14 * 2 + -2);
            }
            uVar3 = uVar3 | uVar12 == uVar10;
            lVar11 = lVar14 + -1;
            bVar2 = 0 < lVar14;
            lVar14 = lVar11;
          } while (lVar11 != 0 && bVar2);
        }
        bVar2 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar2);
      goto LAB_005196a3;
    }
    break;
  case 1:
    if (0 < valids) {
      bVar13 = ctrl & 3;
      uVar15 = (ulong)uVar12;
      uVar3 = 0;
      switch(bVar13) {
      case 1:
        goto switchD_005195da_caseD_1;
      case 2:
        goto switchD_005195da_caseD_2;
      case 3:
        goto switchD_005195da_caseD_3;
      }
switchD_005195da_caseD_0:
      uVar8 = (uint)s->_b_ZMMReg[uVar15];
      do {
        lVar14 = (long)(int)(validd | 1U) + 2;
        if (1 < (int)(validd | 1U)) {
          do {
            switch(bVar13) {
            case 0:
              uVar12 = (uint)d->_b_ZMMReg[lVar14 + -4];
              break;
            case 1:
              uVar12 = (uint)*(ushort *)((long)d + lVar14 * 2 + -8);
              break;
            case 2:
              uVar12 = (uint)(char)d->_b_ZMMReg[lVar14 + -4];
              break;
            case 3:
              uVar12 = (uint)*(short *)((long)d + lVar14 * 2 + -8);
            }
            uVar10 = 0;
            if ((int)uVar8 <= (int)uVar12) {
              switch(bVar13) {
              case 0:
                uVar12 = (uint)d->_b_ZMMReg[lVar14 + -5];
                break;
              case 1:
                uVar12 = (uint)*(ushort *)((long)d + lVar14 * 2 + -10);
                break;
              case 2:
                uVar12 = (uint)(char)d->_b_ZMMReg[lVar14 + -5];
                break;
              case 3:
                uVar12 = (uint)*(short *)((long)d + lVar14 * 2 + -10);
              }
              uVar10 = (uint)((int)uVar12 <= (int)uVar8);
            }
            uVar3 = uVar3 | uVar10;
            lVar14 = lVar14 + -2;
          } while (3 < lVar14);
        }
        if ((long)uVar15 < 1) goto LAB_005196a3;
        uVar15 = uVar15 - 1;
        uVar3 = uVar3 * 2;
        switch(bVar13) {
        case 0:
          goto switchD_005195da_caseD_0;
        case 1:
switchD_005195da_caseD_1:
          uVar8 = (uint)s->_w_ZMMReg[uVar15];
          break;
        case 2:
switchD_005195da_caseD_2:
          uVar8 = (uint)(char)s->_b_ZMMReg[uVar15];
          break;
        case 3:
switchD_005195da_caseD_3:
          uVar8 = (uint)(short)s->_w_ZMMReg[uVar15];
        }
      } while( true );
    }
    break;
  case 2:
    uVar3 = uVar8;
    if ((int)uVar8 < (int)uVar12) {
      uVar3 = uVar12;
    }
    uVar10 = uVar8;
    if ((int)uVar12 < (int)uVar8) {
      uVar10 = uVar12;
    }
    lVar11 = (long)(int)uVar12 - (long)(int)uVar8;
    lVar14 = -lVar11;
    if (0 < lVar11) {
      lVar14 = lVar11;
    }
    uVar3 = ~(-1 << (sVar4 - (char)uVar3 & 0x1fU)) << ((byte)lVar14 & 0x1f);
    if (-1 < (int)uVar10) {
      bVar13 = ctrl & 3;
      lVar14 = (ulong)uVar10 + 1;
      do {
        switch(bVar13) {
        case 0:
          uVar8 = (uint)s->_b_ZMMReg[lVar14 + -1];
          switch(bVar13) {
          case 0:
            goto switchD_00519485_caseD_0;
          case 1:
switchD_00519485_caseD_1:
            uVar12 = (uint)*(ushort *)((long)d + lVar14 * 2 + -2);
            break;
          case 2:
switchD_00519485_caseD_2:
            uVar12 = (uint)(char)d->_b_ZMMReg[lVar14 + -1];
            break;
          case 3:
switchD_00519485_caseD_3:
            uVar12 = (uint)*(short *)((long)d + lVar14 * 2 + -2);
          }
          goto LAB_005194b6;
        case 1:
          uVar8 = (uint)*(ushort *)((long)s + lVar14 * 2 + -2);
          switch(bVar13) {
          case 1:
            goto switchD_00519485_caseD_1;
          case 2:
            goto switchD_00519485_caseD_2;
          case 3:
            goto switchD_00519485_caseD_3;
          }
          break;
        case 2:
          uVar8 = (uint)(char)s->_b_ZMMReg[lVar14 + -1];
          switch(bVar13) {
          case 1:
            goto switchD_00519485_caseD_1;
          case 2:
            goto switchD_00519485_caseD_2;
          case 3:
            goto switchD_00519485_caseD_3;
          }
          break;
        case 3:
          uVar8 = (uint)*(short *)((long)s + lVar14 * 2 + -2);
          switch(bVar13) {
          case 1:
            goto switchD_00519485_caseD_1;
          case 2:
            goto switchD_00519485_caseD_2;
          case 3:
            goto switchD_00519485_caseD_3;
          }
        }
switchD_00519485_caseD_0:
        uVar12 = (uint)d->_b_ZMMReg[lVar14 + -1];
LAB_005194b6:
        uVar3 = uVar3 * 2 | (uint)(uVar8 == uVar12);
        lVar11 = lVar14 + -1;
        bVar2 = 0 < lVar14;
        lVar14 = lVar11;
      } while (lVar11 != 0 && bVar2);
    }
    goto LAB_005196a3;
  case 3:
    if (validd == 0) {
      uVar3 = (2 << sVar4) - 1;
      goto LAB_005196a3;
    }
    if (-1 < valids - validd) {
      bVar13 = ctrl & 3;
      uVar15 = (ulong)(uint)(valids - validd);
      puVar16 = s->_w_ZMMReg + uVar15;
      puVar6 = s->_b_ZMMReg + uVar15;
      uVar3 = 0;
      do {
        uVar12 = 1;
        lVar14 = (ulong)uVar8 + 1;
        if (0 < validd) {
          do {
            switch(bVar13) {
            case 0:
              uVar10 = (uint)puVar6[lVar14 + -1];
              switch(bVar13) {
              case 0:
                goto switchD_00519556_caseD_0;
              case 1:
switchD_00519556_caseD_1:
                uVar9 = (uint)*(ushort *)((long)d + lVar14 * 2 + -2);
                break;
              case 2:
switchD_00519556_caseD_2:
                uVar9 = (uint)(char)d->_b_ZMMReg[lVar14 + -1];
                break;
              case 3:
switchD_00519556_caseD_3:
                uVar9 = (uint)*(short *)((long)d + lVar14 * 2 + -2);
              }
              goto LAB_00519581;
            case 1:
              uVar10 = (uint)puVar16[lVar14 + -1];
              switch(bVar13) {
              case 1:
                goto switchD_00519556_caseD_1;
              case 2:
                goto switchD_00519556_caseD_2;
              case 3:
                goto switchD_00519556_caseD_3;
              }
              break;
            case 2:
              uVar10 = (uint)(char)puVar6[lVar14 + -1];
              switch(bVar13) {
              case 1:
                goto switchD_00519556_caseD_1;
              case 2:
                goto switchD_00519556_caseD_2;
              case 3:
                goto switchD_00519556_caseD_3;
              }
              break;
            case 3:
              uVar10 = (uint)(short)puVar16[lVar14 + -1];
              switch(bVar13) {
              case 1:
                goto switchD_00519556_caseD_1;
              case 2:
                goto switchD_00519556_caseD_2;
              case 3:
                goto switchD_00519556_caseD_3;
              }
            }
switchD_00519556_caseD_0:
            uVar9 = (uint)d->_b_ZMMReg[lVar14 + -1];
LAB_00519581:
            if (uVar10 != uVar9) {
              uVar12 = 0;
            }
            lVar11 = lVar14 + -1;
            bVar2 = 0 < lVar14;
            lVar14 = lVar11;
          } while (lVar11 != 0 && bVar2);
        }
        uVar3 = uVar3 * 2 | uVar12;
        puVar6 = puVar6 + -1;
        puVar16 = puVar16 + -1;
        iVar5 = (int)uVar15;
        uVar15 = uVar15 - 1;
      } while (0 < iVar5);
      goto LAB_005196a3;
    }
  }
  uVar3 = 0;
LAB_005196a3:
  bVar13 = (byte)ctrl >> 4 & 3;
  if (bVar13 == 3) {
    uVar3 = ~(-1 << ((byte)valids & 0x1f) ^ uVar3);
  }
  else if (bVar13 == 1) {
    uVar3 = uVar3 ^ (2 << sVar4) - 1U;
  }
  if (uVar3 != 0) {
    env->cc_src = uVar7 | 1;
  }
  if ((uVar3 & 1) != 0) {
    pbVar1 = (byte *)((long)&env->cc_src + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  return uVar3;
}

Assistant:

static inline unsigned pcmpxstrx(CPUX86State *env, Reg *d, Reg *s,
                                 int8_t ctrl, int valids, int validd)
{
    unsigned int res = 0;
    int v;
    int j, i;
    int upper = (ctrl & 1) ? 7 : 15;

    valids--;
    validd--;

    CC_SRC = (valids < upper ? CC_Z : 0) | (validd < upper ? CC_S : 0);

    switch ((ctrl >> 2) & 3) {
    case 0:
        for (j = valids; j >= 0; j--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, j);
            for (i = validd; i >= 0; i--) {
                res |= (v == pcmp_val(d, ctrl, i));
            }
        }
        break;
    case 1:
        for (j = valids; j >= 0; j--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, j);
            for (i = ((validd - 1) | 1); i >= 0; i -= 2) {
                res |= (pcmp_val(d, ctrl, i - 0) >= v &&
                        pcmp_val(d, ctrl, i - 1) <= v);
            }
        }
        break;
    case 2:
        res = (1 << (upper - MAX(valids, validd))) - 1;
        res <<= MAX(valids, validd) - MIN(valids, validd);
        for (i = MIN(valids, validd); i >= 0; i--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, i);
            res |= (v == pcmp_val(d, ctrl, i));
        }
        break;
    case 3:
        if (validd == -1) {
            res = (2 << upper) - 1;
            break;
        }
        for (j = valids - validd; j >= 0; j--) {
            res <<= 1;
            v = 1;
            for (i = validd; i >= 0; i--) {
                v &= (pcmp_val(s, ctrl, i + j) == pcmp_val(d, ctrl, i));
            }
            res |= v;
        }
        break;
    }

    switch ((ctrl >> 4) & 3) {
    case 1:
        res ^= (2 << upper) - 1;
        break;
    case 3:
        res ^= (1 << (valids + 1)) - 1;
        break;
    }

    if (res) {
        CC_SRC |= CC_C;
    }
    if (res & 1) {
        CC_SRC |= CC_O;
    }

    return res;
}